

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O2

duckdb_value duckdb_create_varchar_length(char *text,idx_t length)

{
  Value *this;
  string local_38;
  
  this = (Value *)operator_new(0x40);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,text,text + length);
  duckdb::Value::Value(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (duckdb_value)this;
}

Assistant:

duckdb_value duckdb_create_varchar_length(const char *text, idx_t length) {
	return WrapValue(new duckdb::Value(std::string(text, length)));
}